

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O2

void __thiscall VMState::PushUnknownOpcode(VMState *this)

{
  CommentStatement *this_00;
  StatementPtr local_1c0;
  string local_1b0;
  ostringstream text;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&text);
  NutFunction::PrintOpcode
            (this->m_Parent,(ostream *)&text,this->m_IP + -1,
             (this->m_Parent->m_Instructions).
             super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)this->m_IP + -1);
  this_00 = (CommentStatement *)operator_new(0x38);
  std::__cxx11::stringbuf::str();
  CommentStatement::CommentStatement(this_00,&local_1b0);
  std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CommentStatement,void>
            ((__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> *)&local_1c0,this_00);
  PushStatement(this,&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c0.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&text);
  return;
}

Assistant:

void PushUnknownOpcode( void )
	{
		std::ostringstream text;
		m_Parent.PrintOpcode(text, IP() - 1, m_Parent.m_Instructions[IP() - 1]);
		PushStatement(StatementPtr(new CommentStatement(text.str())));
	}